

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O0

wchar_t * uriParseOwnHostUserInfoNzW
                    (UriParserStateW *state,wchar_t *first,wchar_t *afterLast,
                    UriMemoryManager *memory)

{
  wchar_t *first_00;
  wchar_t *afterPctSubUnres;
  UriMemoryManager *memory_local;
  wchar_t *afterLast_local;
  wchar_t *first_local;
  UriParserStateW *state_local;
  
  if (first < afterLast) {
    switch(*first) {
    case L'!':
    case L'$':
    case L'%':
    case L'&':
    case L'\'':
    case L'(':
    case L')':
    case L'*':
    case L'+':
    case L',':
    case L'-':
    case L'.':
    case L'0':
    case L'1':
    case L'2':
    case L'3':
    case L'4':
    case L'5':
    case L'6':
    case L'7':
    case L'8':
    case L'9':
    case L';':
    case L'=':
    case L'A':
    case L'B':
    case L'C':
    case L'D':
    case L'E':
    case L'F':
    case L'G':
    case L'H':
    case L'I':
    case L'J':
    case L'K':
    case L'L':
    case L'M':
    case L'N':
    case L'O':
    case L'P':
    case L'Q':
    case L'R':
    case L'S':
    case L'T':
    case L'U':
    case L'V':
    case L'W':
    case L'X':
    case L'Y':
    case L'Z':
    case L'_':
    case L'a':
    case L'b':
    case L'c':
    case L'd':
    case L'e':
    case L'f':
    case L'g':
    case L'h':
    case L'i':
    case L'j':
    case L'k':
    case L'l':
    case L'm':
    case L'n':
    case L'o':
    case L'p':
    case L'q':
    case L'r':
    case L's':
    case L't':
    case L'u':
    case L'v':
    case L'w':
    case L'x':
    case L'y':
    case L'z':
    case L'~':
      first_00 = uriParsePctSubUnresW(state,first,afterLast,memory);
      if (first_00 == (wchar_t *)0x0) {
        state_local = (UriParserStateW *)0x0;
      }
      else {
        state_local = (UriParserStateW *)uriParseOwnHostUserInfoW(state,first_00,afterLast,memory);
      }
      break;
    default:
      uriStopSyntaxW(state,first,memory);
      state_local = (UriParserStateW *)0x0;
      break;
    case L':':
      (state->uri->hostText).afterLast = first;
      (state->uri->portText).first = first + 1;
      state_local = (UriParserStateW *)uriParseOwnPortUserInfoW(state,first + 1,afterLast,memory);
      break;
    case L'@':
      (state->uri->userInfo).afterLast = first;
      (state->uri->hostText).first = first + 1;
      state_local = (UriParserStateW *)uriParseOwnHostW(state,first + 1,afterLast,memory);
    }
  }
  else {
    uriStopSyntaxW(state,afterLast,memory);
    state_local = (UriParserStateW *)0x0;
  }
  return (wchar_t *)state_local;
}

Assistant:

static const URI_CHAR * URI_FUNC(ParseOwnHostUserInfoNz)(
		URI_TYPE(ParserState) * state, const URI_CHAR * first,
		const URI_CHAR * afterLast, UriMemoryManager * memory) {
	if (first >= afterLast) {
		URI_FUNC(StopSyntax)(state, afterLast, memory);
		return NULL;
	}

	switch (*first) {
	case _UT('!'):
	case _UT('$'):
	case _UT('%'):
	case _UT('&'):
	case _UT('('):
	case _UT(')'):
	case _UT('-'):
	case _UT('*'):
	case _UT(','):
	case _UT('.'):
	case _UT(';'):
	case _UT('\''):
	case _UT('_'):
	case _UT('~'):
	case _UT('+'):
	case _UT('='):
	case URI_SET_DIGIT:
	case URI_SET_ALPHA:
		{
			const URI_CHAR * const afterPctSubUnres
					= URI_FUNC(ParsePctSubUnres)(state, first, afterLast, memory);
			if (afterPctSubUnres == NULL) {
				return NULL;
			}
			return URI_FUNC(ParseOwnHostUserInfo)(state, afterPctSubUnres, afterLast, memory);
		}

	case _UT(':'):
		state->uri->hostText.afterLast = first; /* HOST END */
		state->uri->portText.first = first + 1; /* PORT BEGIN */
		return URI_FUNC(ParseOwnPortUserInfo)(state, first + 1, afterLast, memory);

	case _UT('@'):
		state->uri->userInfo.afterLast = first; /* USERINFO END */
		state->uri->hostText.first = first + 1; /* HOST BEGIN */
		return URI_FUNC(ParseOwnHost)(state, first + 1, afterLast, memory);

	default:
		URI_FUNC(StopSyntax)(state, first, memory);
		return NULL;
	}
}